

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraKateGenerator::GenerateFilesString_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraKateGenerator *this,cmLocalGenerator *lg)

{
  cmGlobalGenerator *pcVar1;
  pointer puVar2;
  cmMakefile *pcVar3;
  pointer pbVar4;
  pointer puVar5;
  bool bVar6;
  string *psVar7;
  _Base_ptr p_Var8;
  pointer puVar9;
  string *listFile;
  pointer pbVar10;
  pointer puVar11;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *lgen;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string s;
  string local_80;
  cmAlphaNum local_60;
  
  psVar7 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(lg);
  files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (psVar7->_M_dataplus)._M_p;
  files._M_t._M_impl._0_8_ = psVar7->_M_string_length;
  local_60.View_._M_len = 5;
  local_60.View_._M_str = "/.git";
  cmStrCat<>(&s,(cmAlphaNum *)&files,&local_60);
  bVar6 = cmsys::SystemTools::FileExists(&s);
  if (bVar6) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"\"git\": 1 ",(allocator<char> *)&files);
  }
  else {
    psVar7 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(lg);
    files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (psVar7->_M_dataplus)._M_p;
    files._M_t._M_impl._0_8_ = psVar7->_M_string_length;
    local_60.View_._M_len = 5;
    local_60.View_._M_str = "/.svn";
    cmStrCat<>(&local_80,(cmAlphaNum *)&files,&local_60);
    std::__cxx11::string::operator=((string *)&s,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    bVar6 = cmsys::SystemTools::FileExists(&s);
    if (bVar6) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"\"svn\": 1 ",(allocator<char> *)&files);
    }
    else {
      psVar7 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(lg);
      files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (psVar7->_M_dataplus)._M_p;
      files._M_t._M_impl._0_8_ = psVar7->_M_string_length;
      local_60.View_._M_str = local_60.Digits_;
      local_60.View_._M_len = 1;
      local_60.Digits_[0] = '/';
      cmStrCat<>(&local_80,(cmAlphaNum *)&files,&local_60);
      std::__cxx11::string::operator=((string *)&s,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      files._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &files._M_t._M_impl.super__Rb_tree_header._M_header;
      files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      files._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
      puVar2 = (pcVar1->LocalGenerators).
               super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      files._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (puVar9 = (pcVar1->LocalGenerators).
                    super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar2; puVar9 = puVar9 + 1
          ) {
        pcVar3 = ((puVar9->_M_t).
                  super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                  .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile;
        pbVar4 = *(pointer *)
                  ((long)&(pcVar3->ListFiles).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  + 8);
        for (pbVar10 = *(pointer *)
                        &(pcVar3->ListFiles).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl; pbVar10 != pbVar4; pbVar10 = pbVar10 + 1) {
          std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&files,__return_storage_ptr__);
        }
        puVar5 = *(pointer *)
                  ((long)&(pcVar3->SourceFiles).
                          super__Vector_base<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
                  + 8);
        for (puVar11 = *(pointer *)
                        &(pcVar3->SourceFiles).
                         super__Vector_base<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
                         ._M_impl; puVar11 != puVar5; puVar11 = puVar11 + 1) {
          bVar6 = cmSourceFile::GetIsGenerated
                            ((cmSourceFile *)
                             (puVar11->_M_t).
                             super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>
                             ,GlobalAndLocal);
          if (!bVar6) {
            cmSourceFile::ResolveFullPath
                      ((cmSourceFile *)
                       (puVar11->_M_t).
                       super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>,
                       (string *)0x0,(string *)0x0);
            std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&files,__return_storage_ptr__);
          }
        }
      }
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
      for (p_Var8 = files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 != &files._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&files._M_t);
    }
  }
  std::__cxx11::string::~string((string *)&s);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraKateGenerator::GenerateFilesString(
  const cmLocalGenerator& lg) const
{
  std::string s = cmStrCat(lg.GetSourceDirectory(), "/.git");
  if (cmSystemTools::FileExists(s)) {
    return "\"git\": 1 ";
  }

  s = cmStrCat(lg.GetSourceDirectory(), "/.svn");
  if (cmSystemTools::FileExists(s)) {
    return "\"svn\": 1 ";
  }

  s = cmStrCat(lg.GetSourceDirectory(), '/');

  std::set<std::string> files;
  std::string tmp;
  const auto& lgs = this->GlobalGenerator->GetLocalGenerators();

  for (const auto& lgen : lgs) {
    cmMakefile* makefile = lgen->GetMakefile();
    const std::vector<std::string>& listFiles = makefile->GetListFiles();
    for (std::string const& listFile : listFiles) {
      tmp = listFile;
      {
        files.insert(tmp);
      }
    }

    for (const auto& sf : makefile->GetSourceFiles()) {
      if (sf->GetIsGenerated()) {
        continue;
      }

      tmp = sf->ResolveFullPath();
      files.insert(tmp);
    }
  }

  const char* sep = "";
  tmp = "\"list\": [";
  for (std::string const& f : files) {
    tmp += sep;
    tmp += " \"";
    tmp += f;
    tmp += "\"";
    sep = ",";
  }
  tmp += "] ";

  return tmp;
}